

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_union.cc
# Opt level: O2

void __thiscall S2CellUnion::Expand(S2CellUnion *this,S1Angle min_radius,int max_level_diff)

{
  pointer pSVar1;
  int expand_level;
  int iVar2;
  S2CellUnion *__range1;
  int iVar3;
  pointer pSVar4;
  double dVar5;
  S2CellId id;
  
  pSVar1 = (this->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar3 = 0x1e;
  for (pSVar4 = (this->cell_ids_).super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
                super__Vector_impl_data._M_start; pSVar4 != pSVar1; pSVar4 = pSVar4 + 1) {
    id.id_ = pSVar4->id_;
    iVar2 = S2CellId::level(&id);
    if (iVar2 < iVar3) {
      iVar3 = iVar2;
    }
  }
  iVar2 = S2::Metric<1>::GetLevelForMinValue((Metric<1> *)&S2::kMinWidth,min_radius.radians_);
  if (iVar2 == 0) {
    dVar5 = S2::Metric<1>::GetValue((Metric<1> *)&S2::kMinWidth,0);
    if (dVar5 < min_radius.radians_) {
      Expand(this,0);
    }
  }
  expand_level = iVar3 + max_level_diff;
  if (iVar2 < iVar3 + max_level_diff) {
    expand_level = iVar2;
  }
  Expand(this,expand_level);
  return;
}

Assistant:

void S2CellUnion::Expand(S1Angle min_radius, int max_level_diff) {
  int min_level = S2CellId::kMaxLevel;
  for (S2CellId id : *this) {
    min_level = min(min_level, id.level());
  }
  // Find the maximum level such that all cells are at least "min_radius" wide.
  int radius_level = S2::kMinWidth.GetLevelForMinValue(min_radius.radians());
  if (radius_level == 0 && min_radius.radians() > S2::kMinWidth.GetValue(0)) {
    // The requested expansion is greater than the width of a face cell.
    // The easiest way to handle this is to expand twice.
    Expand(0);
  }
  Expand(min(min_level + max_level_diff, radius_level));
}